

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::Action<bool_()>::Action(Action<bool_()> *this,ActionInterface<bool_()> *impl)

{
  __shared_ptr<testing::ActionInterface<bool()>,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  std::__shared_ptr<testing::ActionInterface<bool()>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<testing::ActionInterface<bool()>,void>(local_20,impl);
  std::function<bool()>::function<testing::Action<bool()>::ActionAdapter,void>
            ((function<bool()> *)this,(ActionAdapter *)local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}